

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall
MT32Emu::RendererImpl<short>::produceLA32Output
          (RendererImpl<short> *this,IntSample *buffer,Bit32u len)

{
  Bit16s BVar1;
  DACInputMode DVar2;
  Bit32u local_1c;
  ushort *puStack_18;
  Bit32u len_local;
  IntSample *buffer_local;
  RendererImpl<short> *this_local;
  
  DVar2 = Synth::getDACInputMode((this->super_Renderer).synth);
  local_1c = len;
  puStack_18 = (ushort *)buffer;
  if (DVar2 == DACInputMode_NICE) {
    while (local_1c != 0) {
      BVar1 = Synth::clipSampleEx((int)(short)*puStack_18 << 1);
      *puStack_18 = BVar1;
      puStack_18 = (ushort *)((short *)puStack_18 + 1);
      local_1c = local_1c - 1;
    }
  }
  else if (DVar2 == DACInputMode_GENERATION2) {
    while (local_1c != 0) {
      *puStack_18 = *puStack_18 & 0x8000 | (*puStack_18 & 0x3fff) << 1 |
                    (short)*puStack_18 >> 0xe & 1U;
      puStack_18 = puStack_18 + 1;
      local_1c = local_1c - 1;
    }
  }
  return;
}

Assistant:

void RendererImpl<IntSample>::produceLA32Output(IntSample *buffer, Bit32u len) {
	switch (synth.getDACInputMode()) {
		case DACInputMode_GENERATION2:
			while (len--) {
				*buffer = (*buffer & 0x8000) | ((*buffer << 1) & 0x7FFE) | ((*buffer >> 14) & 0x0001);
				++buffer;
			}
			break;
		case DACInputMode_NICE:
			while (len--) {
				*buffer = Synth::clipSampleEx(IntSampleEx(*buffer) << 1);
				++buffer;
			}
			break;
		default:
			break;
	}
}